

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void * leveldb::anon_unknown_1::PosixEnv::BGThreadWrapper(void *arg)

{
  void *arg_local;
  
  BGThread((PosixEnv *)arg);
  return (void *)0x0;
}

Assistant:

static void *BGThreadWrapper(void *arg) {
                reinterpret_cast<PosixEnv *>(arg)->BGThread();
                return NULL;
            }